

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,Matrix<float,__1,__1,_0,__1,__1> *lhs,
               Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *rhs,
               Scalar *alpha)

{
  float fVar1;
  float *pfVar2;
  ReturnType RVar3;
  RhsNested actual_rhs;
  BlockImpl_dense<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
  local_a8;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,1,_1,false>> local_58 [56];
  
  if ((lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows == 1)
  {
    fVar1 = *alpha;
    Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_58,lhs,0)
    ;
    BlockImpl_dense<const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_-1,_1,_true,_true>
    ::BlockImpl_dense(&local_a8,rhs,0);
    RVar3 = MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,1,-1,false>>::
            dot<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>>
                      (local_58,(MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                                 *)&local_a8);
    pfVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *pfVar2 = RVar3 * fVar1 + *pfVar2;
  }
  else {
    local_a8.
    super_MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
    ._16_1_ = rhs->field_0x10;
    local_a8.
    super_MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
    .m_data = *(PointerType *)rhs;
    local_a8.
    super_MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_0>
    .m_rows.m_value = *(long *)&rhs->field_0x8;
    gemv_dense_selector<2,0,true>::
    run<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (lhs,(Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
               dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }